

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O1

bool __thiscall features::sort(features *this,uint64_t parse_mask)

{
  string *psVar1;
  unsigned_long *puVar2;
  long lVar3;
  unsigned_long *puVar4;
  long lVar5;
  ulong uVar6;
  v_array<feature_slice> slice;
  feature_slice temp;
  v_array<feature_slice> local_b8;
  unsigned_long *local_98;
  unsigned_long *local_90;
  feature_slice local_88;
  
  puVar4 = (this->indicies)._begin;
  local_98 = (this->indicies)._end;
  if (local_98 != puVar4) {
    if ((this->space_names)._end == (this->space_names)._begin) {
      local_88.space_name.first._M_dataplus._M_p = (pointer)0x0;
      local_88.space_name.first._M_string_length = 0;
      local_88._0_8_ = (feature *)0x0;
      local_88.weight_index = 0;
      puVar2 = (this->indicies)._begin;
      if ((this->indicies)._end != puVar2) {
        uVar6 = 0;
        do {
          local_b8._end = (feature_slice *)(puVar2[uVar6] & parse_mask);
          local_b8._begin =
               (feature_slice *)CONCAT44(local_b8._begin._4_4_,(this->values)._begin[uVar6]);
          v_array<feature>::push_back((v_array<feature> *)&local_88,(feature *)&local_b8);
          uVar6 = uVar6 + 1;
          puVar2 = (this->indicies)._begin;
        } while (uVar6 < (ulong)((long)(this->indicies)._end - (long)puVar2 >> 3));
      }
      qsort((void *)local_88._0_8_,(long)(local_88.weight_index - local_88._0_8_) >> 4,0x10,
            order_features<feature>);
      if (local_88.weight_index != local_88._0_8_) {
        lVar3 = 0;
        uVar6 = 0;
        do {
          (this->values)._begin[uVar6] = *(float *)((long)(float *)local_88._0_8_ + lVar3);
          (this->indicies)._begin[uVar6] = *(unsigned_long *)((long)(local_88._0_8_ + 8) + lVar3);
          uVar6 = uVar6 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar6 < (ulong)((long)(local_88.weight_index - local_88._0_8_) >> 4));
      }
      if ((feature *)local_88._0_8_ != (feature *)0x0) {
        free((void *)local_88._0_8_);
      }
    }
    else {
      local_b8.end_array = (feature_slice *)0x0;
      local_b8.erase_count = 0;
      local_b8._begin = (feature_slice *)0x0;
      local_b8._end = (feature_slice *)0x0;
      puVar2 = (this->indicies)._begin;
      local_90 = puVar4;
      if ((this->indicies)._end != puVar2) {
        lVar3 = 0;
        uVar6 = 0;
        do {
          local_88.x = (this->values)._begin[uVar6];
          local_88.weight_index = puVar2[uVar6] & parse_mask;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&local_88 + 0x10),
                 *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   **)((long)&(((this->space_names)._begin)->
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + lVar3));
          v_array<feature_slice>::push_back(&local_b8,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.space_name.second._M_dataplus._M_p != &local_88.space_name.second.field_2)
          {
            operator_delete(local_88.space_name.second._M_dataplus._M_p);
          }
          if (local_88.space_name.first._M_dataplus._M_p != (pointer)((long)&local_88 + 0x20U)) {
            operator_delete(local_88.space_name.first._M_dataplus._M_p);
          }
          uVar6 = uVar6 + 1;
          puVar2 = (this->indicies)._begin;
          lVar3 = lVar3 + 0x10;
        } while (uVar6 < (ulong)((long)(this->indicies)._end - (long)puVar2 >> 3));
      }
      qsort(local_b8._begin,((long)local_b8._end - (long)local_b8._begin >> 4) * -0x3333333333333333
            ,0x50,order_features<feature_slice>);
      if (local_b8._end != local_b8._begin) {
        lVar5 = 0x30;
        lVar3 = 0;
        uVar6 = 0;
        do {
          (this->values)._begin[uVar6] = *(float *)((long)local_b8._begin + lVar5 + -0x30);
          (this->indicies)._begin[uVar6] = *(unsigned_long *)((long)local_b8._begin + lVar5 + -0x28)
          ;
          psVar1 = *(string **)
                    ((long)&(((this->space_names)._begin)->
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + lVar3);
          std::__cxx11::string::_M_assign(psVar1);
          std::__cxx11::string::_M_assign(psVar1 + 0x20);
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x50;
          lVar3 = lVar3 + 0x10;
        } while (uVar6 < (ulong)(((long)local_b8._end - (long)local_b8._begin >> 4) *
                                -0x3333333333333333));
      }
      v_array<feature_slice>::delete_v(&local_b8);
      puVar4 = local_90;
    }
  }
  return local_98 != puVar4;
}

Assistant:

features_value_iterator(feature_value* begin) : _begin(begin) {}